

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_spec.cpp
# Opt level: O3

bool __thiscall FParser::spec_if(FParser *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  svalue_t eval;
  svalue_t local_38;
  
  local_38.string.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_38.type = 1;
  local_38.value.i = 0;
  iVar1 = FindOperator(this,0,this->NumTokens + -1,")");
  if (iVar1 == -1) {
    bVar4 = false;
    script_error("parse error in if statement\n");
  }
  else {
    EvaluateExpression(this,&local_38,2,iVar1 + -1);
    iVar2 = intvalue(&local_38);
    if (((this->Section == (DFsSection *)0x0) || (this->BraceType != 0)) ||
       (iVar1 != this->NumTokens + -1)) {
      if (iVar2 != 0) {
        iVar2 = this->NumTokens + -1;
        bVar4 = true;
        if (iVar1 != iVar2) {
          EvaluateExpression(this,&local_38,iVar1 + 1,iVar2);
        }
        goto LAB_006b2937;
      }
    }
    else {
      bVar4 = true;
      if (iVar2 != 0) goto LAB_006b2937;
      pcVar3 = DFsScript::SectionEnd(this->Script,this->Section);
      this->Rover = pcVar3 + 1;
    }
    bVar4 = false;
  }
LAB_006b2937:
  FString::~FString(&local_38.string);
  return bVar4;
}

Assistant:

bool FParser::spec_if()
{
	int endtoken;
	svalue_t eval;
	
	
	if((endtoken = FindOperator(0, NumTokens-1, ")")) == -1)
    {
		script_error("parse error in if statement\n");
		return false;
    }
	
	// 2 to skip past the 'if' and '('
	EvaluateExpression(eval, 2, endtoken-1);
	bool ifresult = !!intvalue(eval);
	
	if(Section && BraceType == bracket_open && endtoken == NumTokens-1)
    {
		// {} braces
		if(!ifresult)       // skip to end of section
			Rover = Script->SectionEnd(Section) + 1;
    }
	else if(ifresult) // if() without {} braces
	{
		// nothing to do ?
		if(endtoken != NumTokens-1)
			EvaluateExpression(eval, endtoken+1, NumTokens-1);
	}
	
	return ifresult;
}